

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall re2::Regexp::ParseState::PushDot(ParseState *this)

{
  ParseFlags PVar1;
  Regexp *this_00;
  CharClassBuilder *this_01;
  
  PVar1 = this->flags_;
  if ((PVar1 & (NeverNL|DotNL)) == DotNL) {
    PushSimpleOp(this,kRegexpAnyChar);
  }
  else {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,
           PVar1 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                    Latin1|OneLine|MatchNL|Literal));
    this_01 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(this_01);
    (this_00->field_7).field_3.ccb_ = this_01;
    CharClassBuilder::AddRange(this_01,0,9);
    CharClassBuilder::AddRange((this_00->field_7).field_3.ccb_,0xb,this->rune_max_);
    PushRegexp(this,this_00);
  }
  return true;
}

Assistant:

bool Regexp::ParseState::PushDot() {
  if ((flags_ & DotNL) && !(flags_ & NeverNL))
    return PushSimpleOp(kRegexpAnyChar);
  // Rewrite . into [^\n]
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  re->ccb_->AddRange(0, '\n' - 1);
  re->ccb_->AddRange('\n' + 1, rune_max_);
  return PushRegexp(re);
}